

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

void __thiscall filesystem::path::set(path *this,string *str,path_type type)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  allocator local_51;
  string local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  this->m_type = type;
  if (type == windows_path) {
    std::__cxx11::string::string((string *)&local_50,"/\\",&local_51);
    tokenize(&local_30,str,&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&this->m_path,&local_30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    if (1 < str->_M_string_length) {
      pcVar3 = (str->_M_dataplus)._M_p;
      iVar2 = isalpha((int)*pcVar3);
      if (iVar2 != 0) {
        pcVar3 = pcVar3 + 1;
        cVar1 = ':';
        goto LAB_00a42bed;
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"/",&local_51);
    tokenize(&local_30,str,&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&this->m_path,&local_30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    if (str->_M_string_length != 0) {
      pcVar3 = (str->_M_dataplus)._M_p;
      cVar1 = '/';
LAB_00a42bed:
      bVar4 = *pcVar3 == cVar1;
      goto LAB_00a42bf7;
    }
  }
  bVar4 = false;
LAB_00a42bf7:
  this->m_absolute = bVar4;
  return;
}

Assistant:

void set(const std::string &str, path_type type = native_path) {
        m_type = type;
        if (type == windows_path) {
            m_path = tokenize(str, "/\\");
            m_absolute = str.size() >= 2 && std::isalpha(str[0]) && str[1] == ':';
        } else {
            m_path = tokenize(str, "/");
            m_absolute = !str.empty() && str[0] == '/';
        }
    }